

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int mbedtls_ecp_mul(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_mpi *m,mbedtls_ecp_point *P,
                   _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_mpi *X;
  mbedtls_mpi *Y;
  mbedtls_mpi *X_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  uchar swap;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  mbedtls_ecp_point *pmVar11;
  mbedtls_ecp_point *R_00;
  byte w;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  byte local_298;
  mbedtls_ecp_point *local_290;
  mbedtls_mpi AA;
  mbedtls_mpi A;
  mbedtls_mpi E;
  mbedtls_mpi B;
  mbedtls_mpi D;
  mbedtls_mpi BB;
  mbedtls_mpi local_1a0;
  mbedtls_mpi DA;
  mbedtls_mpi C;
  mbedtls_ecp_point RP;
  mbedtls_mpi local_48;
  
  iVar1 = mbedtls_mpi_cmp_int(&P->Z,1);
  if (iVar1 != 0) {
    return -0x4f80;
  }
  iVar1 = mbedtls_ecp_check_privkey(grp,m);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = mbedtls_ecp_check_pubkey(grp,P);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = 0;
  if (((grp->G).X.p != (mbedtls_mpi_uint *)0x0) && ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0)) {
    mbedtls_mpi_init(&RP.X);
    mbedtls_mpi_init(&RP.Y);
    mbedtls_mpi_init(&RP.Z);
    mbedtls_mpi_init(&local_48);
    iVar1 = mbedtls_mpi_copy(&local_48,&P->X);
    if ((iVar1 == 0) &&
       ((iVar1 = mbedtls_ecp_copy(&RP,P), iVar1 == 0 &&
        (iVar1 = mbedtls_mpi_lset(&R->X,1), iVar1 == 0)))) {
      X = &R->Z;
      iVar1 = mbedtls_mpi_lset(X,0);
      if (iVar1 == 0) {
        mbedtls_mpi_free(&R->Y);
        Y = &grp->P;
        do {
          iVar1 = mbedtls_mpi_cmp_mpi(&RP.X,Y);
          if (iVar1 < 0) {
            if ((f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) ||
               (iVar1 = ecp_randomize_mxz(grp,&RP,f_rng,p_rng), iVar1 == 0)) {
              sVar5 = mbedtls_mpi_bitlen(m);
              goto LAB_0011c1e9;
            }
            break;
          }
          iVar1 = mbedtls_mpi_sub_abs(&RP.X,&RP.X,Y);
        } while (iVar1 == 0);
      }
    }
LAB_0011bd8d:
    mbedtls_mpi_free(&RP.X);
    mbedtls_mpi_free(&RP.Y);
    mbedtls_mpi_free(&RP.Z);
    mbedtls_mpi_free(&local_48);
  }
  if ((grp->G).X.p == (mbedtls_mpi_uint *)0x0) {
    return iVar1;
  }
  if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
    return iVar1;
  }
  mbedtls_mpi_init(&A);
  mbedtls_mpi_init(&AA);
  iVar1 = mbedtls_mpi_get_bit(&grp->N,0);
  if (iVar1 != 1) {
    return -0x4f80;
  }
  uVar4 = grp->nbits;
  iVar1 = mbedtls_mpi_cmp_mpi(&P->Y,&(grp->G).Y);
  if (iVar1 == 0) {
    iVar1 = mbedtls_mpi_cmp_mpi(&P->X,&(grp->G).X);
    bVar15 = iVar1 == 0;
  }
  else {
    bVar15 = false;
  }
  bVar9 = (0x17f < uVar4 | 4U) + bVar15;
  w = 2;
  if ((ulong)bVar9 < grp->nbits) {
    w = bVar9;
  }
  uVar2 = 1 << (w - 1 & 0x1f);
  uVar6 = (ulong)w;
  uVar12 = (grp->nbits + uVar6) - 1;
  local_290 = (mbedtls_ecp_point *)0x0;
  uVar4 = uVar12 / uVar6;
  if (bVar15 != false) {
    local_290 = grp->T;
  }
  local_298 = (byte)uVar2;
  if (local_290 == (mbedtls_ecp_point *)0x0) {
    local_290 = (mbedtls_ecp_point *)calloc((ulong)uVar2 & 0xff,0x48);
    if (local_290 == (mbedtls_ecp_point *)0x0) {
      iVar1 = -0x4d80;
      local_290 = (mbedtls_ecp_point *)0x0;
      goto LAB_0011c0af;
    }
    iVar1 = mbedtls_ecp_copy(local_290,P);
    if (iVar1 == 0) {
      uVar8 = 1;
      uVar10 = 0;
      do {
        pmVar11 = local_290 + uVar8;
        iVar1 = mbedtls_ecp_copy(pmVar11,local_290 + (uVar8 >> 1));
        if (iVar1 != 0) goto LAB_0011c0a1;
        uVar13 = uVar4;
        if (uVar6 <= uVar12) {
          do {
            iVar1 = ecp_double_jac(grp,pmVar11,pmVar11);
            if (iVar1 != 0) goto LAB_0011c0a1;
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
        uVar13 = (ulong)(byte)((char)uVar10 + 1);
        *(mbedtls_ecp_point **)(&RP.X.s + uVar10 * 2) = pmVar11;
        uVar7 = (int)uVar8 * 2 & 0xff;
        uVar8 = (ulong)uVar7;
        uVar10 = uVar13;
      } while (uVar7 < uVar2);
      iVar1 = ecp_normalize_jac_many(grp,(mbedtls_ecp_point **)&RP,uVar13);
      if (iVar1 == 0) {
        uVar6 = 1;
        sVar5 = 0;
        do {
          uVar12 = uVar6 & 0xff;
          iVar3 = (int)uVar12;
          if ((char)uVar6 != '\0') {
            lVar14 = (ulong)(uint)(iVar3 * 8) * 9;
            pmVar11 = (mbedtls_ecp_point *)((long)&local_290[-1].X.s + lVar14);
            R_00 = (mbedtls_ecp_point *)((long)&local_290[-1].X.s + (ulong)(uint)(iVar3 * 0x90));
            uVar6 = sVar5;
            do {
              iVar1 = ecp_add_mixed(grp,R_00,pmVar11,
                                    (mbedtls_ecp_point *)((long)&(local_290->X).s + lVar14));
              if (iVar1 != 0) goto LAB_0011c0a1;
              uVar12 = uVar12 - 1;
              sVar5 = (size_t)(byte)((char)uVar6 + 1);
              *(mbedtls_ecp_point **)(&RP.X.s + uVar6 * 2) = R_00;
              pmVar11 = pmVar11 + -1;
              R_00 = R_00 + -1;
              uVar6 = sVar5;
            } while (uVar12 != 0);
          }
          uVar6 = (ulong)(uint)(iVar3 * 2);
        } while ((byte)(iVar3 * 2) < local_298);
        iVar1 = ecp_normalize_jac_many(grp,(mbedtls_ecp_point **)&RP,sVar5);
      }
    }
LAB_0011c0a1:
    if (iVar1 != 0) goto LAB_0011c0af;
    if (bVar15 != false) {
      grp->T = local_290;
      grp->T_size = (ulong)uVar2 & 0xff;
    }
  }
  iVar3 = mbedtls_mpi_get_bit(m,0);
  iVar1 = mbedtls_mpi_copy(&A,m);
  if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_sub_mpi(&AA,&grp->N,m), iVar1 == 0)) {
    iVar1 = mbedtls_mpi_safe_cond_assign(&A,&AA,iVar3 != 1);
    if (iVar1 == 0) {
      ecp_comb_fixed((uchar *)&RP,uVar4,w,&A);
      iVar1 = ecp_mul_comb_core(grp,R,local_290,local_298,(uchar *)&RP,uVar4,f_rng,p_rng);
      if ((iVar1 == 0) && (iVar1 = ecp_safe_invert_jac(grp,R,iVar3 != 1), iVar1 == 0)) {
        iVar1 = ecp_normalize_jac(grp,R);
      }
    }
  }
LAB_0011c0af:
  if ((bVar15 == false) && (local_290 != (mbedtls_ecp_point *)0x0)) {
    lVar14 = 0;
    do {
      mbedtls_ecp_point_free((mbedtls_ecp_point *)((long)&(local_290->X).s + lVar14));
      lVar14 = lVar14 + 0x48;
    } while ((ulong)((uVar2 & 0xff) + (uint)((uVar2 & 0xff) == 0)) * 0x48 != lVar14);
    free(local_290);
  }
  mbedtls_mpi_free(&A);
  mbedtls_mpi_free(&AA);
  if (iVar1 != 0) {
    mbedtls_ecp_point_free(R);
  }
  return iVar1;
LAB_0011c1e9:
  bVar15 = sVar5 == 0;
  sVar5 = sVar5 - 1;
  if (bVar15) {
    iVar1 = ecp_normalize_mxz(grp,R);
    goto LAB_0011bd8d;
  }
  iVar1 = mbedtls_mpi_get_bit(m,sVar5);
  swap = (uchar)iVar1;
  iVar1 = mbedtls_mpi_safe_cond_swap(&R->X,&RP.X,swap);
  if ((iVar1 != 0) || (iVar1 = mbedtls_mpi_safe_cond_swap(X,&RP.Z,swap), iVar1 != 0))
  goto LAB_0011bd8d;
  mbedtls_mpi_init(&A);
  mbedtls_mpi_init(&AA);
  mbedtls_mpi_init(&B);
  mbedtls_mpi_init(&BB);
  mbedtls_mpi_init(&E);
  mbedtls_mpi_init(&C);
  mbedtls_mpi_init(&D);
  mbedtls_mpi_init(&DA);
  mbedtls_mpi_init(&local_1a0);
  iVar1 = mbedtls_mpi_add_mpi(&A,&R->X,X);
  if (iVar1 == 0) {
    do {
      iVar1 = mbedtls_mpi_cmp_mpi(&A,Y);
      if (iVar1 < 0) {
        iVar1 = mbedtls_mpi_mul_mpi(&AA,&A,&A);
        if ((iVar1 == 0) && (iVar1 = ecp_modp(&AA,grp), iVar1 == 0)) {
          mul_count = mul_count + 1;
          iVar1 = mbedtls_mpi_sub_mpi(&B,&R->X,X);
          goto joined_r0x0011c415;
        }
        break;
      }
      iVar1 = mbedtls_mpi_sub_abs(&A,&A,Y);
    } while (iVar1 == 0);
  }
LAB_0011c323:
  mbedtls_mpi_free(&A);
  mbedtls_mpi_free(&AA);
  mbedtls_mpi_free(&B);
  mbedtls_mpi_free(&BB);
  mbedtls_mpi_free(&E);
  mbedtls_mpi_free(&C);
  mbedtls_mpi_free(&D);
  mbedtls_mpi_free(&DA);
  mbedtls_mpi_free(&local_1a0);
  if (((iVar1 != 0) || (iVar1 = mbedtls_mpi_safe_cond_swap(&R->X,&RP.X,swap), iVar1 != 0)) ||
     (iVar1 = mbedtls_mpi_safe_cond_swap(X,&RP.Z,swap), iVar1 != 0)) goto LAB_0011bd8d;
  goto LAB_0011c1e9;
joined_r0x0011c415:
  if (iVar1 != 0) goto LAB_0011c323;
  if ((-1 < B.s) || (iVar1 = mbedtls_mpi_cmp_int(&B,0), iVar1 == 0)) {
    iVar1 = mbedtls_mpi_mul_mpi(&BB,&B,&B);
    if ((iVar1 == 0) && (iVar1 = ecp_modp(&BB,grp), iVar1 == 0)) {
      mul_count = mul_count + 1;
      iVar1 = mbedtls_mpi_sub_mpi(&E,&AA,&BB);
      goto joined_r0x0011c4bf;
    }
    goto LAB_0011c323;
  }
  iVar1 = mbedtls_mpi_add_mpi(&B,&B,Y);
  goto joined_r0x0011c415;
joined_r0x0011c4bf:
  if (iVar1 != 0) goto LAB_0011c323;
  if ((-1 < E.s) || (iVar1 = mbedtls_mpi_cmp_int(&E,0), iVar1 == 0)) {
    iVar1 = mbedtls_mpi_add_mpi(&C,&RP.X,&RP.Z);
    goto joined_r0x0011c527;
  }
  iVar1 = mbedtls_mpi_add_mpi(&E,&E,Y);
  goto joined_r0x0011c4bf;
joined_r0x0011c527:
  if (iVar1 != 0) goto LAB_0011c323;
  iVar1 = mbedtls_mpi_cmp_mpi(&C,Y);
  if (iVar1 < 0) {
    iVar1 = mbedtls_mpi_sub_mpi(&D,&RP.X,&RP.Z);
    goto joined_r0x0011c59a;
  }
  iVar1 = mbedtls_mpi_sub_abs(&C,&C,Y);
  goto joined_r0x0011c527;
joined_r0x0011c59a:
  if (iVar1 != 0) goto LAB_0011c323;
  if ((-1 < D.s) || (iVar1 = mbedtls_mpi_cmp_int(&D,0), iVar1 == 0)) {
    iVar1 = mbedtls_mpi_mul_mpi(&DA,&D,&A);
    if ((iVar1 == 0) && (iVar1 = ecp_modp(&DA,grp), iVar1 == 0)) {
      mul_count = mul_count + 1;
      iVar1 = mbedtls_mpi_mul_mpi(&local_1a0,&C,&B);
      if ((iVar1 == 0) && (iVar1 = ecp_modp(&local_1a0,grp), iVar1 == 0)) {
        mul_count = mul_count + 1;
        iVar1 = mbedtls_mpi_add_mpi(&RP.X,&DA,&local_1a0);
        if ((iVar1 == 0) && (iVar1 = ecp_modp(&RP.X,grp), iVar1 == 0)) {
          mul_count = mul_count + 1;
          iVar1 = mbedtls_mpi_mul_mpi(&RP.X,&RP.X,&RP.X);
          if ((iVar1 == 0) && (iVar1 = ecp_modp(&RP.X,grp), iVar1 == 0)) {
            mul_count = mul_count + 1;
            iVar1 = mbedtls_mpi_sub_mpi(&RP.Z,&DA,&local_1a0);
            goto joined_r0x0011c710;
          }
        }
      }
    }
    goto LAB_0011c323;
  }
  iVar1 = mbedtls_mpi_add_mpi(&D,&D,Y);
  goto joined_r0x0011c59a;
joined_r0x0011c710:
  if (iVar1 != 0) goto LAB_0011c323;
  if ((-1 < RP.Z.s) || (iVar1 = mbedtls_mpi_cmp_int(&RP.Z,0), iVar1 == 0)) {
    X_00 = &RP.Z;
    iVar1 = mbedtls_mpi_mul_mpi(X_00,X_00,X_00);
    if ((iVar1 == 0) && (iVar1 = ecp_modp(&RP.Z,grp), iVar1 == 0)) {
      mul_count = mul_count + 1;
      iVar1 = mbedtls_mpi_mul_mpi(&RP.Z,&local_48,&RP.Z);
      if ((iVar1 == 0) && (iVar1 = ecp_modp(&RP.Z,grp), iVar1 == 0)) {
        mul_count = mul_count + 1;
        iVar1 = mbedtls_mpi_mul_mpi(&R->X,&AA,&BB);
        if ((iVar1 == 0) && (iVar1 = ecp_modp(&R->X,grp), iVar1 == 0)) {
          mul_count = mul_count + 1;
          iVar1 = mbedtls_mpi_mul_mpi(X,&grp->A,&E);
          if ((iVar1 == 0) && (iVar1 = ecp_modp(X,grp), iVar1 == 0)) {
            mul_count = mul_count + 1;
            iVar1 = mbedtls_mpi_add_mpi(X,&BB,X);
            goto joined_r0x0011c86b;
          }
        }
      }
    }
    goto LAB_0011c323;
  }
  iVar1 = mbedtls_mpi_add_mpi(&RP.Z,&RP.Z,Y);
  goto joined_r0x0011c710;
joined_r0x0011c86b:
  if (iVar1 != 0) goto LAB_0011c323;
  iVar1 = mbedtls_mpi_cmp_mpi(X,Y);
  if (iVar1 < 0) {
    iVar1 = mbedtls_mpi_mul_mpi(X,&E,X);
    if ((iVar1 == 0) && (iVar1 = ecp_modp(X,grp), iVar1 == 0)) {
      mul_count = mul_count + 1;
      iVar1 = 0;
    }
    goto LAB_0011c323;
  }
  iVar1 = mbedtls_mpi_sub_abs(X,X,Y);
  goto joined_r0x0011c86b;
}

Assistant:

int mbedtls_ecp_mul( mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
             const mbedtls_mpi *m, const mbedtls_ecp_point *P,
             int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    int ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
#if defined(MBEDTLS_ECP_INTERNAL_ALT)
    char is_grp_capable = 0;
#endif

    /* Common sanity checks */
    if( mbedtls_mpi_cmp_int( &P->Z, 1 ) != 0 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    if( ( ret = mbedtls_ecp_check_privkey( grp, m ) ) != 0 ||
        ( ret = mbedtls_ecp_check_pubkey( grp, P ) ) != 0 )
        return( ret );

#if defined(MBEDTLS_ECP_INTERNAL_ALT)
    if ( is_grp_capable = mbedtls_internal_ecp_grp_capable( grp )  )
    {
        MBEDTLS_MPI_CHK( mbedtls_internal_ecp_init( grp ) );
    }

#endif /* MBEDTLS_ECP_INTERNAL_ALT */
#if defined(ECP_MONTGOMERY)
    if( ecp_get_type( grp ) == ECP_TYPE_MONTGOMERY )
        ret = ecp_mul_mxz( grp, R, m, P, f_rng, p_rng );

#endif
#if defined(ECP_SHORTWEIERSTRASS)
    if( ecp_get_type( grp ) == ECP_TYPE_SHORT_WEIERSTRASS )
        ret = ecp_mul_comb( grp, R, m, P, f_rng, p_rng );

#endif
#if defined(MBEDTLS_ECP_INTERNAL_ALT)
cleanup:

    if ( is_grp_capable )
    {
        mbedtls_internal_ecp_free( grp );
    }

#endif /* MBEDTLS_ECP_INTERNAL_ALT */
    return( ret );
}